

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O2

psa_status_t psa_its_remove(psa_storage_uid_t uid)

{
  int iVar1;
  psa_status_t pVar2;
  FILE *__stream;
  char filename [25];
  char acStack_28 [32];
  
  psa_its_fill_filename(uid,acStack_28);
  __stream = fopen(acStack_28,"rb");
  if (__stream == (FILE *)0x0) {
    pVar2 = -0x8c;
  }
  else {
    fclose(__stream);
    iVar1 = remove(acStack_28);
    pVar2 = -0x92;
    if (iVar1 == 0) {
      pVar2 = 0;
    }
  }
  return pVar2;
}

Assistant:

psa_status_t psa_its_remove( psa_storage_uid_t uid )
{
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    FILE *stream;
    psa_its_fill_filename( uid, filename );
    stream = fopen( filename, "rb" );
    if( stream == NULL )
        return( PSA_ERROR_DOES_NOT_EXIST );
    fclose( stream );
    if( remove( filename ) != 0 )
        return( PSA_ERROR_STORAGE_FAILURE );
    return( PSA_SUCCESS );
}